

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O2

FT_Error sdf_generate_subdivision
                   (SDF_Params internal_params,SDF_Shape *shape,FT_UInt spread,FT_Bitmap *bitmap)

{
  uint *puVar1;
  int *piVar2;
  byte bVar3;
  SDF_Edge_Type SVar4;
  uchar *puVar5;
  long lVar6;
  SDF_Contour *pSVar7;
  FT_Bitmap *pFVar8;
  FT_SDFFormat FVar9;
  FT_Error FVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  FT_Pointer P;
  ulong uVar16;
  long lVar17;
  FT_Long FVar18;
  long lVar19;
  FT_Fixed FVar20;
  int iVar21;
  undefined4 in_register_0000000c;
  long lVar22;
  ulong uVar23;
  SDF_Contour *pSVar24;
  ulong uVar25;
  FT_UInt max_splits;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  short sVar31;
  uint uVar32;
  long lVar33;
  SDF_Edge *pSVar34;
  SDF_Edge *pSVar35;
  FT_Memory vector;
  uint uVar36;
  uint uVar37;
  FT_Memory pFVar38;
  uint uVar39;
  SDF_Edge **ppSVar40;
  SDF_Edge *pSVar41;
  SDF_Contour *pSVar42;
  SDF_Shape *pSVar43;
  FT_Memory pFVar44;
  long lVar45;
  ulong uVar46;
  bool bVar47;
  byte bVar48;
  SDF_Edge *new_edges;
  FT_Alloc_Func local_1b8;
  SDF_Contour *tempc;
  SDF_Shape *local_1a8;
  undefined8 local_1a0;
  SDF_Contour *local_198;
  SDF_Contour *local_190;
  FT_Pointer local_188;
  uint local_180;
  int local_17c;
  ulong local_178;
  SDF_Contour *local_170;
  long local_168;
  FT_Memory local_160;
  ulong local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  ulong local_128;
  SDF_Edge *local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  FT_Int local_f0;
  int local_ec;
  FT_26D6_Vec ctrls [3];
  ulong local_90;
  FT_Bitmap *local_80;
  FT_Orientation local_50;
  SDF_Edge *temp;
  
  local_128 = CONCAT44(in_register_0000000c,spread);
  local_f0 = internal_params.overload_sign;
  bVar48 = 0;
  FVar10 = 6;
  if ((shape != (SDF_Shape *)0x0) && (pFVar44 = shape->memory, pFVar44 != (FT_Memory)0x0)) {
    local_170 = (SDF_Contour *)&shape->contours;
    pSVar24 = shape->contours;
    pSVar42 = (SDF_Contour *)0x0;
    local_1a8 = shape;
    local_1a0 = bitmap;
    while (pFVar8 = local_1a0, pSVar7 = tempc, pSVar24 != (SDF_Contour *)0x0) {
      pSVar41 = pSVar24->edges;
      new_edges = (SDF_Edge *)0x0;
      local_198 = pSVar24;
      local_190 = pSVar42;
      for (; pSVar41 != (SDF_Edge *)0x0; pSVar41 = pSVar41->next) {
        SVar4 = pSVar41->edge_type;
        if (SVar4 == SDF_EDGE_CUBIC) {
          ctrls[0].x = (pSVar41->start_pos).x;
          ctrls[0].y = (pSVar41->start_pos).y;
          ctrls[1].x = (pSVar41->control_a).x;
          ctrls[1].y = (pSVar41->control_a).y;
          ctrls[2].x = (pSVar41->control_b).x;
          ctrls[2].y = (pSVar41->control_b).y;
          iVar11 = split_sdf_cubic(pFVar44,ctrls,0x20,&new_edges);
LAB_00200e72:
          if (iVar11 != 0) {
            return iVar11;
          }
        }
        else {
          if (SVar4 == SDF_EDGE_CONIC) {
            ctrls[0].x = (pSVar41->start_pos).x;
            ctrls[0].y = (pSVar41->start_pos).y;
            ctrls[1].x = (pSVar41->control_a).x;
            ctrls[1].y = (pSVar41->control_a).y;
            ctrls[2].x = (pSVar41->end_pos).x;
            ctrls[2].y = (pSVar41->end_pos).y;
            uVar15 = ctrls[0].x + ctrls[2].x + ctrls[1].x * -2;
            uVar16 = -uVar15;
            if (0 < (long)uVar15) {
              uVar16 = uVar15;
            }
            uVar23 = ctrls[0].y + ctrls[2].y + ctrls[1].y * -2;
            uVar15 = -uVar23;
            if (0 < (long)uVar23) {
              uVar15 = uVar23;
            }
            if ((int)uVar15 < (int)uVar16) {
              uVar15 = uVar16;
            }
            max_splits = 1;
            for (uVar15 = uVar15 & 0xffffffff; 8 < (int)(uint)uVar15;
                uVar15 = (ulong)((uint)uVar15 >> 2)) {
              max_splits = max_splits * 2;
            }
            iVar11 = split_sdf_conic(pFVar44,ctrls,max_splits,&new_edges);
            goto LAB_00200e72;
          }
          if (SVar4 != SDF_EDGE_LINE) {
            return 6;
          }
          FVar10 = sdf_edge_new(pFVar44,&temp);
          if (FVar10 != 0) {
            return FVar10;
          }
          pSVar34 = pSVar41;
          pSVar35 = temp;
          for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
            (pSVar35->start_pos).x = (pSVar34->start_pos).x;
            pSVar34 = (SDF_Edge *)((long)pSVar34 + (ulong)bVar48 * -0x10 + 8);
            pSVar35 = (SDF_Edge *)((long)pSVar35 + (ulong)bVar48 * -0x10 + 8);
          }
          temp->next = new_edges;
          new_edges = temp;
        }
      }
      FVar10 = sdf_contour_new(pFVar44,&tempc);
      pSVar42 = tempc;
      if (FVar10 != 0) {
        return FVar10;
      }
      tempc->next = local_190;
      tempc->edges = new_edges;
      new_edges = (SDF_Edge *)0x0;
      tempc = local_198;
      pSVar24 = local_198->next;
      sdf_contour_done(pFVar44,&tempc);
    }
    (local_170->last_pos).x = (FT_Pos)pSVar42;
    tempc = (SDF_Contour *)((ulong)tempc & 0xffffffff00000000);
    if (((local_1a0 == (FT_Bitmap *)0x0) || ((int)local_128 - 0x21U < 0xffffffe1)) ||
       (pFVar44 = local_1a8->memory, pFVar44 == (FT_Memory)0x0)) {
      tempc._4_4_ = SUB84(pSVar7,4);
      tempc = (SDF_Contour *)CONCAT44(tempc._4_4_,6);
      pFVar44 = (FT_Memory)0x0;
      P = (void *)0x0;
    }
    else {
      vector = pFVar44;
      P = ft_mem_alloc(pFVar44,(ulong)(local_1a0->rows * local_1a0->width) * 0xc,(FT_Error *)&tempc)
      ;
      if ((int)tempc == 0) {
        local_178 = (ulong)(int)pFVar8->width;
        uVar26 = pFVar8->rows;
        local_188 = P;
        if (uVar26 == 0 || local_178 == 0) {
          tempc = (SDF_Contour *)CONCAT44(tempc._4_4_,0x13);
        }
        else {
          local_17c = (int)local_128 << 0x10;
          puVar5 = pFVar8->buffer;
          uVar16 = local_128 & 0xffffffff;
          local_180 = uVar26;
          for (; pSVar24 = (SDF_Contour *)(local_170->last_pos).x, pSVar24 != (SDF_Contour *)0x0;
              local_170 = (SDF_Contour *)&local_170->next) {
            ppSVar40 = &pSVar24->edges;
            local_170 = pSVar24;
            while (pSVar41 = *ppSVar40, pSVar41 != (SDF_Edge *)0x0) {
              lVar22 = (pSVar41->start_pos).x;
              lVar17 = (pSVar41->start_pos).y;
              lVar27 = (pSVar41->end_pos).x;
              lVar29 = (pSVar41->end_pos).y;
              SVar4 = pSVar41->edge_type;
              lVar33 = lVar22;
              lVar45 = lVar17;
              if (SVar4 == SDF_EDGE_LINE) {
LAB_0020108f:
                if (lVar27 < lVar33) {
                  lVar33 = lVar27;
                }
                if (lVar22 < lVar27) {
                  lVar22 = lVar27;
                }
                if (lVar29 < lVar45) {
                  lVar45 = lVar29;
                }
                if (lVar17 < lVar29) {
                  lVar17 = lVar29;
                }
                iVar11 = (int)((lVar33 + -0x3f) / 0x40);
                lVar22 = (lVar22 + 0x3f) / 0x40;
                vector = (FT_Memory)(lVar45 + -0x3f);
                iVar21 = (int)((long)vector / 0x40);
                lVar17 = (lVar17 + 0x3f) / 0x40;
              }
              else {
                lVar19 = (pSVar41->control_a).x;
                lVar28 = (pSVar41->control_a).y;
                lVar33 = lVar19;
                lVar45 = lVar28;
                if (SVar4 == SDF_EDGE_CONIC) {
LAB_0020106b:
                  if (lVar22 < lVar33) {
                    lVar33 = lVar22;
                  }
                  if (lVar22 <= lVar19) {
                    lVar22 = lVar19;
                  }
                  if (lVar17 < lVar45) {
                    lVar45 = lVar17;
                  }
                  if (lVar17 <= lVar28) {
                    lVar17 = lVar28;
                  }
                  goto LAB_0020108f;
                }
                if (SVar4 == SDF_EDGE_CUBIC) {
                  lVar45 = (pSVar41->control_b).x;
                  lVar6 = (pSVar41->control_b).y;
                  lVar33 = lVar45;
                  if (lVar19 < lVar45) {
                    lVar33 = lVar19;
                  }
                  if (lVar19 <= lVar45) {
                    lVar19 = lVar45;
                  }
                  lVar45 = lVar6;
                  if (lVar28 < lVar6) {
                    lVar45 = lVar28;
                  }
                  if (lVar28 <= lVar6) {
                    lVar28 = lVar6;
                  }
                  goto LAB_0020106b;
                }
                iVar11 = 0;
                iVar21 = 0;
                lVar22 = 0;
                lVar17 = 0;
              }
              iVar12 = (int)local_128;
              lVar27 = (long)(iVar21 - iVar12);
              local_120 = pSVar41;
              while (lVar27 < (long)(lVar17 + uVar16)) {
                pSVar24 = (SDF_Contour *)(lVar27 << 6 | 0x20);
                uVar39 = ~(uint)lVar27 + local_180;
                if (internal_params._0_8_ >> 0x28 != 0) {
                  uVar39 = (uint)lVar27;
                }
                iVar21 = uVar39 * (int)local_178;
                lVar29 = (long)(iVar11 - iVar12);
                local_190 = pSVar24;
                local_130 = lVar27;
                while (lVar29 < (long)(lVar22 + uVar16)) {
                  local_168 = lVar29;
                  if (((lVar29 < (long)local_178) &&
                      ((((uint)lVar29 | (uint)local_130) & 0x80000000) == 0)) &&
                     (local_130 < (int)uVar26)) {
                    local_198 = (SDF_Contour *)(lVar29 << 6 | 0x20);
                    SVar4 = pSVar41->edge_type;
                    if (SVar4 == SDF_EDGE_CUBIC) {
                      local_108 = (pSVar41->start_pos).x;
                      local_110 = (pSVar41->start_pos).y;
                      lVar27 = (pSVar41->control_a).x;
                      lVar29 = (pSVar41->control_a).y;
                      lVar33 = (pSVar41->control_b).x;
                      lVar45 = (pSVar41->control_b).y;
                      lVar28 = ((local_108 - lVar27) - lVar27) + lVar33;
                      lVar19 = ((local_110 - lVar29) - lVar29) + lVar45;
                      local_140 = (lVar27 - local_108) * 3;
                      local_138 = (lVar29 - local_110) * 3;
                      local_1a8 = (SDF_Shape *)
                                  (long)((((int)lVar27 - (int)lVar33) * 3 - (int)local_108) +
                                        (int)(pSVar41->end_pos).x);
                      local_150 = lVar28 * 6;
                      local_80 = (FT_Bitmap *)(lVar28 * 0x300000000 >> 0x20);
                      local_118 = (lVar27 - local_108) * 0x300000000 >> 0x20;
                      lVar27 = (long)((((int)lVar29 - (int)lVar45) * 3 - (int)local_110) +
                                     (int)(pSVar41->end_pos).y);
                      local_158 = lVar19 * 6;
                      lVar33 = lVar19 * 0x300000000 >> 0x20;
                      local_148 = (lVar29 - local_110) * 0x300000000 >> 0x20;
                      uVar15 = 0x7fffffff;
                      local_90 = 0;
                      uVar39 = 0;
                      iVar14 = 0;
                      local_1a0 = local_80;
                      local_100 = lVar27;
                      local_f8 = lVar33;
                      while (iVar13 = (int)uVar15, iVar14 != 5) {
                        uVar32 = iVar14 << 0xe;
                        sVar31 = 5;
                        local_160 = vector;
                        local_ec = iVar14;
                        do {
                          sVar31 = sVar31 + -1;
                          if (sVar31 == 0) break;
                          uVar23 = (ulong)uVar32;
                          uVar46 = uVar23 * uVar23 + 0x8000;
                          uVar25 = uVar46 >> 0x10 & 0xffffffff;
                          uVar30 = uVar25 * uVar23 + 0x8000 >> 0x10 & 0xffffffff;
                          lVar29 = uVar30 * (long)local_1a8;
                          lVar27 = uVar30 * lVar27;
                          lVar29 = ((int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) +
                                   (int)(uVar25 * (long)local_1a0 + 0x8000 +
                                         ((long)(uVar25 * (long)local_1a0) >> 0x3f) >> 0x10) +
                                   (int)(local_118 * uVar23 + 0x8000 +
                                         ((long)(local_118 * uVar23) >> 0x3f) >> 0x10)) + local_108;
                          lVar45 = ((int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) +
                                   (int)(uVar25 * lVar33 + 0x8000 +
                                         ((long)(uVar25 * lVar33) >> 0x3f) >> 0x10) +
                                   (int)(uVar23 * local_148 + 0x8000 +
                                         ((long)(uVar23 * local_148) >> 0x3f) >> 0x10)) + local_110;
                          new_edges = (SDF_Edge *)((lVar29 - (long)local_198) * 0x400);
                          local_1b8 = (FT_Alloc_Func)((lVar45 - (long)local_190) * 0x400);
                          uVar23 = FT_Vector_Length((FT_Vector *)&new_edges);
                          lVar33 = local_f8;
                          lVar27 = local_100;
                          if ((int)uVar23 < (int)uVar15) {
                            local_160 = (FT_Memory)(lVar45 * 0x400);
                            ctrls[0].x = lVar29 * 0x400;
                            uVar15 = uVar23 & 0xffffffff;
                            local_90 = uVar46 >> 0x10 & 0xffffffff;
                            ctrls[0].y = (FT_Pos)local_160;
                            local_80 = (FT_Bitmap *)ctrls[0].x;
                            uVar39 = uVar32;
                          }
                          uVar23 = (ulong)(uint)((int)(uVar46 >> 0x10) * 3);
                          lVar29 = uVar23 * (long)local_1a8;
                          lVar45 = (long)local_1a0 * (ulong)(uVar32 * 2);
                          lVar19 = ((int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) +
                                   (int)((ulong)(lVar45 + 0x8000 + (lVar45 >> 0x3f)) >> 0x10)) +
                                   local_140;
                          lVar29 = uVar23 * local_100;
                          lVar45 = (ulong)(uVar32 * 2) * local_f8;
                          lVar28 = ((int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) +
                                   (int)((ulong)(lVar45 + 0x8000 + (lVar45 >> 0x3f)) >> 0x10)) +
                                   local_138;
                          lVar45 = (long)local_1a8 * (long)(int)(uVar32 * 6);
                          lVar29 = (int)(uVar32 * 6) * local_100;
                          new_edges = (SDF_Edge *)((long)new_edges / 0x400);
                          local_1b8 = (FT_Alloc_Func)((long)local_1b8 / 0x400);
                          FVar18 = FT_DivFix((long)((int)(((long)local_1b8 * lVar28) / 0x40) +
                                                   (int)(((long)new_edges * lVar19) / 0x40)),
                                             (long)((int)((long)(((long)(int)((ulong)(lVar29 + 
                                                  0x8000 + (lVar29 >> 0x3f)) >> 0x10) + local_158) *
                                                  (long)local_1b8) / 0x40) +
                                                  (int)((((int)((ulong)(lVar45 + 0x8000 +
                                                                       (lVar45 >> 0x3f)) >> 0x10) +
                                                         local_150) * (long)new_edges) / 0x40) +
                                                  (int)((ulong)(lVar19 * lVar19) >> 6) +
                                                  (int)((ulong)(lVar28 * lVar28) >> 6)));
                          uVar32 = uVar32 - (int)FVar18;
                        } while (uVar32 < 0x10001);
                        vector = local_160;
                        pSVar41 = local_120;
                        iVar14 = local_ec + 1;
                      }
                      lVar29 = (long)((int)local_90 * 3);
                      lVar19 = (long)local_1a8 * lVar29;
                      lVar45 = (long)local_1a0 * (ulong)(uVar39 * 2);
                      new_edges = (SDF_Edge *)
                                  (((int)((ulong)(lVar19 + 0x8000 + (lVar19 >> 0x3f)) >> 0x10) +
                                   (int)((ulong)(lVar45 + 0x8000 + (lVar45 >> 0x3f)) >> 0x10)) +
                                  local_140);
                      lVar27 = lVar27 * lVar29;
                      lVar33 = lVar33 * (ulong)(uVar39 * 2);
                      local_1b8 = (FT_Alloc_Func)
                                  (((int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) +
                                   (int)((ulong)(lVar33 + 0x8000 + (lVar33 >> 0x3f)) >> 0x10)) +
                                  local_138);
                      lVar27 = (long)local_80 + (long)local_198 * -0x400;
                      lVar33 = (long)(int)local_1b8 * (long)(int)lVar27;
                      vector = vector + (long)pSVar24 * -0x20;
                      lVar29 = (long)(int)new_edges * (long)(int)vector;
                      bVar47 = (int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) <=
                               (int)((ulong)(lVar33 + 0x8000 + (lVar33 >> 0x3f)) >> 0x10);
                      uVar32 = 0x10000;
                      pFVar38 = vector;
                      if ((uVar39 & 0xfffeffff) == 0) {
LAB_00201cc6:
                        ctrls[0].y = (FT_Pos)pFVar38;
                        ctrls[0].x = lVar27;
                        FT_Vector_NormLen((FT_Vector *)&new_edges);
                        vector = (FT_Memory)ctrls;
                        FT_Vector_NormLen((FT_Vector *)vector);
                        uVar32 = (int)((ulong)((long)(int)ctrls[0].y * (long)(int)new_edges + 0x8000
                                              + ((long)(int)ctrls[0].y * (long)(int)new_edges >>
                                                0x3f)) >> 0x10) -
                                 (int)((ulong)((long)(int)ctrls[0].x * (long)(int)local_1b8 + 0x8000
                                              + ((long)(int)ctrls[0].x * (long)(int)local_1b8 >>
                                                0x3f)) >> 0x10);
                      }
LAB_00201d28:
                    }
                    else {
                      if (SVar4 == SDF_EDGE_CONIC) {
                        local_138 = (pSVar41->start_pos).x;
                        local_140 = (pSVar41->start_pos).y;
                        lVar27 = (pSVar41->control_a).x;
                        lVar29 = (pSVar41->control_a).y;
                        local_108 = ((local_138 - lVar27) - lVar27) + (pSVar41->end_pos).x;
                        local_118 = ((local_140 - lVar29) - lVar29) + (pSVar41->end_pos).y;
                        local_1a8 = (SDF_Shape *)((lVar27 - local_138) * 2);
                        local_1a0 = (FT_Bitmap *)((lVar29 - local_140) * 2);
                        lVar33 = (long)(int)local_108;
                        local_f8 = (lVar27 - local_138 << 0x21) >> 0x20;
                        lVar27 = (long)(int)local_118;
                        local_100 = (lVar29 - local_140 << 0x21) >> 0x20;
                        local_108 = local_108 * 2;
                        local_118 = local_118 * 2;
                        uVar15 = 0x7fffffff;
                        local_148 = 0;
                        local_150 = 0;
                        local_158 = local_158 & 0xffffffff00000000;
                        iVar14 = 0;
                        local_110 = lVar33;
                        while (iVar13 = (int)uVar15, iVar14 != 5) {
                          local_160 = (FT_Memory)CONCAT44(local_160._4_4_,iVar14);
                          uVar39 = iVar14 << 0xe;
                          sVar31 = 5;
                          do {
                            sVar31 = sVar31 + -1;
                            if (sVar31 == 0) break;
                            uVar23 = (ulong)uVar39;
                            uVar25 = uVar23 * uVar23 + 0x8000 >> 0x10 & 0xffffffff;
                            lVar33 = uVar25 * lVar33;
                            lVar45 = ((int)((ulong)(lVar33 + 0x8000 + (lVar33 >> 0x3f)) >> 0x10) +
                                     (int)(local_f8 * uVar23 + 0x8000 +
                                           ((long)(local_f8 * uVar23) >> 0x3f) >> 0x10)) + local_138
                            ;
                            lVar29 = uVar25 * lVar27;
                            lVar29 = ((int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) +
                                     (int)(uVar23 * local_100 + 0x8000 +
                                           ((long)(uVar23 * local_100) >> 0x3f) >> 0x10)) +
                                     local_140;
                            new_edges = (SDF_Edge *)((lVar45 - (long)local_198) * 0x400);
                            local_1b8 = (FT_Alloc_Func)((lVar29 - (long)local_190) * 0x400);
                            uVar23 = FT_Vector_Length((FT_Vector *)&new_edges);
                            lVar33 = local_110;
                            if ((int)uVar23 < (int)uVar15) {
                              local_148 = lVar29 * 0x400;
                              local_150 = lVar45 * 0x400;
                              uVar15 = uVar23 & 0xffffffff;
                              local_158 = CONCAT44(local_158._4_4_,uVar39);
                              ctrls[0].x = local_150;
                              ctrls[0].y = local_148;
                            }
                            lVar29 = local_110 * (ulong)(uVar39 * 2);
                            lVar45 = (long)&local_1a8->memory +
                                     (long)(int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10
                                                );
                            lVar29 = (ulong)(uVar39 * 2) * lVar27;
                            lVar29 = (long)&local_1a0->rows +
                                     (long)(int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10
                                                );
                            new_edges = (SDF_Edge *)((long)new_edges / 0x400);
                            local_1b8 = (FT_Alloc_Func)((long)local_1b8 / 0x400);
                            FVar18 = FT_DivFix((long)((int)(((long)local_1b8 * lVar29) / 0x40) +
                                                     (int)(((long)new_edges * lVar45) / 0x40)),
                                               (long)((int)(((long)local_1b8 * local_118) / 0x40) +
                                                     (int)(((long)new_edges * local_108) / 0x40) +
                                                     (int)((ulong)(lVar45 * lVar45) >> 6) +
                                                     (int)((ulong)(lVar29 * lVar29) >> 6)));
                            uVar39 = uVar39 - (int)FVar18;
                          } while (uVar39 < 0x10001);
                          pSVar41 = local_120;
                          iVar14 = (int)local_160 + 1;
                        }
                        uVar15 = (ulong)(int)local_158;
                        vector = (FT_Memory)0x8000;
                        new_edges = (SDF_Edge *)
                                    ((long)&local_1a8->memory +
                                    ((long)(int)(lVar33 * uVar15 + 0x8000 +
                                                 ((long)(lVar33 * uVar15) >> 0x3f) >> 0xf) &
                                    0xfffffffffffffffeU));
                        local_1b8 = (FT_Alloc_Func)
                                    ((long)&local_1a0->rows +
                                    ((long)(int)(lVar27 * uVar15 + 0x8000 +
                                                 ((long)(lVar27 * uVar15) >> 0x3f) >> 0xf) &
                                    0xfffffffffffffffeU));
                        lVar27 = local_150 + (long)local_198 * -0x400;
                        lVar33 = (long)(int)local_1b8 * (long)(int)lVar27;
                        pFVar38 = (FT_Memory)(local_148 + (long)pSVar24 * -0x400);
                        lVar29 = (long)(int)new_edges * (long)(int)pFVar38;
                        bVar47 = (int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) <=
                                 (int)((ulong)(lVar33 + 0x8000 + (lVar33 >> 0x3f)) >> 0x10);
                        uVar32 = 0x10000;
                        if ((uVar15 & 0xfffeffff) == 0) goto LAB_00201cc6;
                        goto LAB_00201d28;
                      }
                      if (SVar4 != SDF_EDGE_LINE) {
                        tempc = (SDF_Contour *)CONCAT44(tempc._4_4_,6);
                        P = local_188;
                        goto LAB_00200f80;
                      }
                      lVar27 = (pSVar41->start_pos).x;
                      lVar29 = (pSVar41->start_pos).y;
                      lVar45 = (pSVar41->end_pos).x - lVar27;
                      lVar33 = (pSVar41->end_pos).y - lVar29;
                      ctrls[0].x = lVar45;
                      ctrls[0].y = lVar33;
                      FVar18 = FT_DivFix((long)((int)((((long)local_190 - lVar29) * lVar33) / 0x40)
                                               + (int)((((long)local_198 - lVar27) * lVar45) / 0x40)
                                               ),(long)((int)((ulong)(lVar33 * lVar33) >> 6) +
                                                       (int)((ulong)(lVar45 * lVar45) >> 6)));
                      uVar32 = 0x10000;
                      uVar37 = (uint)FVar18;
                      uVar39 = 0x10000;
                      if ((int)uVar37 < 0x10000) {
                        uVar39 = uVar37;
                      }
                      if ((int)uVar39 < 1) {
                        uVar39 = 0;
                      }
                      lVar19 = (long)((int)lVar45 << 10) * (ulong)uVar39;
                      lVar28 = (long)((int)lVar33 << 10) * (ulong)uVar39;
                      new_edges = (SDF_Edge *)
                                  ((lVar27 - (long)local_198) * 0x400 +
                                  (lVar19 + 0x8000 + (lVar19 >> 0x3f) >> 0x10));
                      local_1b8 = (FT_Alloc_Func)
                                  ((lVar29 - (long)local_190) * 0x400 +
                                  (lVar28 + 0x8000 + (lVar28 >> 0x3f) >> 0x10));
                      lVar27 = (long)(int)lVar33 * (long)(int)new_edges;
                      lVar29 = (long)(int)lVar45 * (long)(int)local_1b8;
                      bVar47 = (int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) <=
                               (int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10);
                      vector = (FT_Memory)&new_edges;
                      FVar20 = FT_Vector_Length((FT_Vector *)vector);
                      if (0xfffe < uVar37 - 1) {
                        FT_Vector_NormLen(ctrls);
                        vector = (FT_Memory)&new_edges;
                        FT_Vector_NormLen((FT_Vector *)vector);
                        uVar32 = (int)((ulong)((long)(int)local_1b8 * (long)(int)ctrls[0].x + 0x8000
                                              + ((long)(int)local_1b8 * (long)(int)ctrls[0].x >>
                                                0x3f)) >> 0x10) -
                                 (int)((ulong)((long)(int)new_edges * (long)(int)ctrls[0].y + 0x8000
                                              + ((long)(int)new_edges * (long)(int)ctrls[0].y >>
                                                0x3f)) >> 0x10);
                      }
                      iVar13 = (int)FVar20;
                      pSVar41 = local_120;
                    }
                    tempc = (SDF_Contour *)((ulong)tempc._4_4_ << 0x20);
                    local_50 = internal_params.orientation;
                    bVar48 = -(-bVar47 | 1U);
                    if (local_50 != FT_ORIENTATION_FILL_LEFT) {
                      bVar48 = -bVar47 | 1U;
                    }
                    if (iVar13 <= local_17c) {
                      lVar27 = (ulong)(uint)(iVar21 + (int)local_168) * 0xc;
                      puVar1 = (uint *)((long)local_188 + lVar27);
                      bVar3 = *(byte *)((long)local_188 + lVar27 + 8);
                      if (bVar3 == 0) {
LAB_00201dde:
                        *(ulong *)puVar1 = CONCAT44(uVar32,iVar13);
                        *(byte *)(puVar1 + 2) = bVar48;
                        *(undefined2 *)((long)puVar1 + 9) = 0;
                        *(undefined1 *)((long)puVar1 + 0xb) = 0;
                      }
                      else {
                        uVar39 = *puVar1;
                        vector = (FT_Memory)(ulong)uVar39;
                        uVar36 = uVar39 - iVar13;
                        uVar37 = -uVar36;
                        if (0 < (int)uVar36) {
                          uVar37 = uVar36;
                        }
                        if (uVar37 < 0x21) {
                          vector = *(FT_Memory *)puVar1;
                          uVar37 = (uint)((ulong)vector >> 0x20);
                          uVar39 = -uVar37;
                          if (0 < (int)uVar37) {
                            uVar39 = uVar37;
                          }
                          uVar37 = -uVar32;
                          if (0 < (int)uVar32) {
                            uVar37 = uVar32;
                          }
                          pFVar38 = (FT_Memory)CONCAT44(uVar32,iVar13);
                          if (uVar37 < uVar39) {
                            bVar48 = bVar3;
                            pFVar38 = vector;
                          }
                          *(FT_Memory *)puVar1 = pFVar38;
                          *(byte *)(puVar1 + 2) = bVar48;
                        }
                        else if (iVar13 < (int)uVar39) goto LAB_00201dde;
                      }
                    }
                  }
                  lVar29 = local_168 + 1;
                }
                lVar27 = local_130 + 1;
              }
              ppSVar40 = &pSVar41->next;
            }
          }
          pSVar24 = (SDF_Contour *)0x0;
          local_1a0 = (FT_Bitmap *)(CONCAT44(local_1a0._4_4_,-(uint)(local_f0 == 0)) | 1);
          local_1a8 = (SDF_Shape *)0x0;
          if (0 < (int)local_178) {
            local_1a8 = (SDF_Shape *)(local_178 & 0xffffffff);
          }
          local_190 = (SDF_Contour *)0x0;
          if (0 < (int)local_180) {
            local_190 = (SDF_Contour *)(ulong)local_180;
          }
          P = local_188;
          for (pSVar42 = (SDF_Contour *)0x0; pSVar42 != local_190;
              pSVar42 = (SDF_Contour *)((long)&(pSVar42->last_pos).x + 1)) {
            pSVar43 = local_1a8;
            uVar26 = (uint)local_1a0;
            local_198 = pSVar24;
            while (bVar47 = pSVar43 != (SDF_Shape *)0x0,
                  pSVar43 = (SDF_Shape *)((long)&pSVar43[-1].contours + 7), bVar47) {
              lVar22 = ((ulong)pSVar24 & 0xffffffff) * 0xc;
              piVar2 = (int *)((long)P + lVar22);
              bVar48 = *(byte *)((long)P + lVar22 + 8);
              iVar11 = local_17c;
              if (bVar48 != 0) {
                iVar11 = *piVar2;
                if (local_17c <= iVar11) {
                  iVar11 = local_17c;
                }
                uVar26 = (uint)bVar48;
              }
              iVar21 = -(int)(char)uVar26;
              if (internal_params.flip_sign == '\0') {
                iVar21 = (int)(char)uVar26;
              }
              *piVar2 = iVar21 * iVar11;
              FVar9 = map_fixed_to_sdf(iVar21 * iVar11,local_17c);
              puVar5[(ulong)pSVar24 & 0xffffffff] = FVar9;
              pSVar24 = (SDF_Contour *)((long)&(pSVar24->last_pos).x + 1);
              P = local_188;
            }
            pSVar24 = (SDF_Contour *)((long)&(local_198->last_pos).x + local_178);
          }
        }
      }
    }
LAB_00200f80:
    ft_mem_free(pFVar44,P);
    FVar10 = (int)tempc;
  }
  return FVar10;
}

Assistant:

static FT_Error
  sdf_generate_subdivision( const SDF_Params  internal_params,
                            SDF_Shape*        shape,
                            FT_UInt           spread,
                            const FT_Bitmap*  bitmap )
  {
    /*
     * Thanks to Alexei for providing the idea of this optimization.
     *
     * We take advantage of two facts.
     *
     * (1) Computing the shortest distance from a point to a line segment is
     *     very fast.
     * (2) We don't have to compute the shortest distance for the entire
     *     two-dimensional grid.
     *
     * Both ideas lead to the following optimization.
     *
     * (1) Split the outlines into a number of line segments.
     *
     * (2) For each line segment, only process its neighborhood.
     *
     * (3) Compute the closest distance to the line only for neighborhood
     *     grid points.
     *
     * This greatly reduces the number of grid points to check.
     */

    FT_Error  error = FT_Err_Ok;


    FT_CALL( split_sdf_shape( shape ) );
    FT_CALL( sdf_generate_bounding_box( internal_params,
                                        shape, spread, bitmap ) );

  Exit:
    return error;
  }